

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O0

char32_t __thiscall
pstore::utf::utf16_to_code_point<std::__cxx11::u16string,unsigned_short(*)(unsigned_short)>
          (utf *this,
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *src,
          _func_unsigned_short_unsigned_short *swapper)

{
  bool bVar1;
  _func_unsigned_short_unsigned_short *in_RCX;
  pair<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char32_t>
  pVar2;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_70;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_68 [2];
  char16_t *local_58;
  char32_t local_50;
  char16_t *local_48;
  char16_t *local_40;
  pair<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char32_t>
  local_38;
  char32_t local_24;
  const_iterator cStack_20;
  char32_t cp;
  const_iterator end;
  _func_unsigned_short_unsigned_short *swapper_local;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *src_local;
  
  end._M_current = (char16_t *)src;
  cStack_20 = std::end<std::__cxx11::u16string>
                        ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                          *)this);
  local_40 = (char16_t *)
             std::begin<std::__cxx11::u16string>
                       ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                         *)this);
  local_48 = cStack_20._M_current;
  pVar2 = utf16_to_code_point<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,unsigned_short(*)(unsigned_short)>
                    ((utf *)local_40,
                     (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                      )cStack_20._M_current,
                     (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                      )end._M_current,in_RCX);
  local_58 = (char16_t *)pVar2.first._M_current;
  local_50 = pVar2.second;
  local_38.first._M_current = local_58;
  local_38.second = local_50;
  std::tie<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char32_t>
            (local_68,(char32_t *)&stack0xffffffffffffffe0);
  std::tuple<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>&,char32_t&>::
  operator=((tuple<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>&,char32_t&>
             *)local_68,&local_38);
  local_70._M_current =
       (char16_t *)
       std::end<std::__cxx11::u16string>
                 ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                  this);
  bVar1 = __gnu_cxx::operator==(&stack0xffffffffffffffe0,&local_70);
  if (!bVar1) {
    assert_failed("end == std::end (src)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/utf.hpp"
                  ,0x10f);
  }
  return local_24;
}

Assistant:

auto utf16_to_code_point (InputType const & src, Swapper swapper) -> char32_t {
            auto end = std::end (src);
            char32_t cp;
            std::tie (end, cp) = utf16_to_code_point (std::begin (src), end, swapper);
            PSTORE_ASSERT (end == std::end (src));
            return cp;
        }